

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<capnp::_::RawBrandedSchema_*&> __thiscall
kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::
find<capnp::_::RawSchema_const*&>
          (HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*> *this,RawSchema **key)

{
  Maybe<capnp::_::RawBrandedSchema_*&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry_&> local_28;
  RawSchema **local_20;
  RawSchema **key_local;
  HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*> *this_local;
  
  local_20 = key;
  key_local = (RawSchema **)this;
  local_28 = Table<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>>
             ::find<0ul,capnp::_::RawSchema_const*&>
                       ((Table<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry_&>::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_map_h:358:30)>
                    (&local_28,&local_29);
  return (Maybe<capnp::_::RawBrandedSchema_*&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}